

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaLinkLineComputer.cxx
# Opt level: O3

string * __thiscall
cmNinjaLinkLineComputer::ConvertToLinkReference
          (string *__return_storage_ptr__,cmNinjaLinkLineComputer *this,string *lib)

{
  pointer pcVar1;
  string *psVar2;
  
  psVar2 = cmGlobalNinjaGenerator::ConvertToNinjaPath(this->GG,lib);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaLinkLineComputer::ConvertToLinkReference(
  std::string const& lib) const
{
  return this->GG->ConvertToNinjaPath(lib);
}